

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_progress_bar_display.cpp
# Opt level: O2

void __thiscall duckdb::TerminalProgressBarDisplay::Finish(TerminalProgressBarDisplay *this)

{
  allocator local_29;
  string local_28;
  
  PrintProgressInternal(this,100);
  ::std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_3b657a3 + 8,&local_29);
  Printer::RawPrint(STREAM_STDOUT,&local_28);
  ::std::__cxx11::string::~string((string *)&local_28);
  Printer::Flush(STREAM_STDOUT);
  return;
}

Assistant:

void TerminalProgressBarDisplay::Finish() {
	PrintProgressInternal(100);
	Printer::RawPrint(OutputStream::STREAM_STDOUT, "\n");
	Printer::Flush(OutputStream::STREAM_STDOUT);
}